

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void tinygltf::SerializeGltfImage(Image *image,string *uri,json *o)

{
  allocator local_39;
  string local_38;
  
  if (uri->_M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_38,"mimeType",&local_39);
    SerializeStringProperty(&local_38,&image->mimeType,o);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string((string *)&local_38,"bufferView",&local_39);
    SerializeNumberProperty<int>(&local_38,image->bufferView,o);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,"uri",&local_39);
    SerializeStringProperty(&local_38,uri,o);
  }
  std::__cxx11::string::~string((string *)&local_38);
  if ((image->name)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_38,"name",&local_39);
    SerializeStringProperty(&local_38,&image->name,o);
    std::__cxx11::string::~string((string *)&local_38);
  }
  SerializeExtrasAndExtensions<tinygltf::Image>(image,o);
  return;
}

Assistant:

static void SerializeGltfImage(const Image &image, const std::string &uri,
                               detail::json &o) {
  // From 2.7.0, we look for `uri` parameter, not `Image.uri`
  // if uri is empty, the mimeType and bufferview should be set
  if (uri.empty()) {
    SerializeStringProperty("mimeType", image.mimeType, o);
    SerializeNumberProperty<int>("bufferView", image.bufferView, o);
  } else {
    SerializeStringProperty("uri", uri, o);
  }

  if (image.name.size()) {
    SerializeStringProperty("name", image.name, o);
  }

  SerializeExtrasAndExtensions(image, o);
}